

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDTypes.cpp
# Opt level: O3

bool __thiscall SWDParser::IsOperation(SWDParser *this,SWDOperation *tran)

{
  vector<SWDBit,_std::allocator<SWDBit>_> *pvVar1;
  pointer *ppSVar2;
  vector<SWDBit,_std::allocator<SWDBit>_> *__result;
  SWDBit *pSVar3;
  undefined8 uVar4;
  vector<SWDBit,std::allocator<SWDBit>> *this_00;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  pointer pSVar10;
  size_t __n;
  bool bVar11;
  uint uVar12;
  long lVar13;
  iterator iVar14;
  byte bVar15;
  pointer pSVar16;
  pointer pSVar17;
  long lVar18;
  long lVar19;
  SWDBit local_98;
  vector<SWDBit,std::allocator<SWDBit>> *local_68;
  vector<SWDBit,_std::allocator<SWDBit>_> *local_60;
  SWDBit local_58;
  
  tran->data = 0;
  tran->data_parity = '\0';
  tran->data_parity_ok = false;
  tran->reg = SWDR_undefined;
  tran->APnDP = false;
  tran->RnW = false;
  tran->addr = '\0';
  tran->parity_read = '\0';
  tran->request_byte = '\0';
  tran->ACK = '\0';
  pSVar17 = (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar17) {
    (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.super__Vector_impl_data
    ._M_finish = pSVar17;
  }
  __result = &tran->bits;
  BufferBits(this,0xc);
  pvVar1 = &this->mBitsBuffer;
  pSVar17 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar13 = 0;
  bVar8 = 0;
  do {
    bVar6 = bVar8;
    bVar15 = (*(int *)((long)&pSVar17->state_rising + lVar13) == 1) << 7;
    bVar7 = bVar6 >> 1;
    bVar8 = bVar7 | bVar15;
    lVar13 = lVar13 + 0x28;
  } while (lVar13 != 0x140);
  tran->request_byte = bVar8;
  if ((bVar7 & 0xc1 | bVar15) == 0x81) {
    tran->APnDP = (bool)((bVar7 & 2) >> 1);
    tran->RnW = (bool)(bVar6 >> 3 & 1);
    tran->addr = (bVar7 & 0x18) >> 1;
    bVar9 = (bool)((bVar7 & 0x20) >> 5);
    tran->parity_read = bVar9;
    if ((((pSVar17[4].state_rising != BIT_HIGH) != (pSVar17[3].state_rising == BIT_HIGH)) !=
        ((pSVar17[2].state_rising == BIT_HIGH) != (pSVar17[1].state_rising == BIT_HIGH))) != bVar9)
    {
      SWDOperation::SetRegister(tran,this->mSelectRegister);
      pSVar17 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar8 = (pSVar17[0xb].state_rising == BIT_HIGH) << 2 |
              (pSVar17[10].state_rising == BIT_HIGH) * '\x02' | pSVar17[9].state_rising == BIT_HIGH;
      tran->ACK = bVar8;
      if (bVar8 == 1) {
        BufferBits(this,0x2d);
        pSVar17 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (tran->RnW == false) {
          BufferBits(this,0x2e);
          pSVar17 = pSVar17 + 0xd;
        }
        else {
          pSVar17 = pSVar17 + 0xc;
        }
        lVar13 = 0;
        bVar8 = 0;
        uVar5 = 0;
        do {
          uVar12 = uVar5 >> 1;
          bVar9 = *(int *)((long)&pSVar17->state_rising + lVar13) == 1;
          uVar5 = uVar12 + 0x80000000;
          if (!bVar9) {
            uVar5 = uVar12;
          }
          bVar8 = bVar8 ^ bVar9;
          lVar13 = lVar13 + 0x28;
        } while (lVar13 != 0x500);
        tran->data = uVar5;
        bVar9 = pSVar17[0x20].state_rising == BIT_HIGH;
        tran->data_parity = bVar9;
        bVar9 = (bool)(bVar8 ^ bVar9);
        bVar11 = (bool)(bVar9 ^ 1);
        tran->data_parity_ok = bVar11;
        if (!bVar9) {
          if ((tran->reg == SWDR_DP_SELECT) && (tran->RnW == false)) {
            this->mSelectRegister = uVar5;
          }
          lVar18 = -0x20;
          lVar13 = 0;
          while (lVar19 = lVar13, pSVar10 = (pointer)((long)&pSVar17[0x21].state_rising + lVar19),
                local_68 = (vector<SWDBit,std::allocator<SWDBit>> *)pvVar1, local_60 = __result,
                pSVar10 < (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                          _M_impl.super__Vector_impl_data._M_finish) {
            lVar18 = lVar18 + -1;
            lVar13 = lVar19 + 0x28;
            if (pSVar10->state_rising == BIT_HIGH) {
              pSVar17 = (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if ((tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_finish != pSVar17) {
                (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                super__Vector_impl_data._M_finish = pSVar17;
              }
              pSVar3 = (pvVar1->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<SWDBit*,std::back_insert_iterator<std::vector<SWDBit,std::allocator<SWDBit>>>>
                        (pSVar3,(SWDBit *)((long)&pSVar3[0x21].state_rising + lVar19),
                         (back_insert_iterator<std::vector<SWDBit,_std::allocator<SWDBit>_>_>)
                         __result);
              if (lVar18 == 0) {
                return bVar11;
              }
              pSVar17 = (pvVar1->super__Vector_base<SWDBit,_std::allocator<SWDBit>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pSVar16 = (pointer)((long)&pSVar17[0x21].state_rising + lVar19);
              pSVar10 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              if (pSVar16 != pSVar10) {
                memmove(pSVar17,pSVar16,(long)pSVar10 + (-lVar13 - (long)pSVar17) + -0x500);
                pSVar16 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              pSVar17 = (pointer)((long)pSVar16 + (-0x500 - lVar13));
              if (pSVar17 == pSVar16) {
                return bVar11;
              }
              (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_finish = pSVar17;
              return bVar11;
            }
          }
          ParseBit(&local_58,this);
          pvVar1 = local_60;
          this_00 = local_68;
          local_98.low_end = local_58.low_end;
          local_98.rising = local_58.rising;
          local_98.falling = local_58.falling;
          local_98.state_rising = local_58.state_rising;
          local_98.state_falling = local_58.state_falling;
          uVar4 = local_98._0_8_;
          local_98.low_start = local_58.low_start;
          local_98.state_rising = local_58.state_rising;
          bVar9 = local_98.state_rising != BIT_HIGH;
          local_98._0_8_ = uVar4;
          if (bVar9) {
            do {
              iVar14._M_current =
                   (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar14._M_current ==
                  (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<SWDBit,std::allocator<SWDBit>>::_M_realloc_insert<SWDBit_const&>
                          (this_00,iVar14,&local_98);
              }
              else {
                (iVar14._M_current)->low_end = local_58.low_end;
                (iVar14._M_current)->rising = local_58.rising;
                (iVar14._M_current)->falling = local_58.falling;
                (iVar14._M_current)->state_rising = local_58.state_rising;
                (iVar14._M_current)->state_falling = local_58.state_falling;
                (iVar14._M_current)->low_start = local_58.low_start;
                ppSVar2 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppSVar2 = *ppSVar2 + 1;
              }
              ParseBit(&local_58,this);
              local_98.low_end = local_58.low_end;
              local_98.rising = local_58.rising;
              local_98.falling = local_58.falling;
              local_98.state_rising = local_58.state_rising;
              local_98.state_falling = local_58.state_falling;
              uVar4 = local_98._0_8_;
              local_98.low_start = local_58.low_start;
              local_98.state_rising = local_58.state_rising;
              bVar9 = local_98.state_rising != BIT_HIGH;
              local_98._0_8_ = uVar4;
            } while (bVar9);
          }
          std::vector<SWDBit,_std::allocator<SWDBit>_>::operator=
                    (pvVar1,(vector<SWDBit,_std::allocator<SWDBit>_> *)this_00);
          pSVar3 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar14._M_current =
               (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar14._M_current != pSVar3) {
            (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_finish = pSVar3;
            iVar14._M_current = pSVar3;
          }
          if (iVar14._M_current !=
              (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            (iVar14._M_current)->low_end = local_98.low_end;
            (iVar14._M_current)->rising = local_98.rising;
            (iVar14._M_current)->falling = local_98.falling;
            (iVar14._M_current)->state_rising = local_98.state_rising;
            (iVar14._M_current)->state_falling = local_98.state_falling;
            (iVar14._M_current)->low_start = local_98.low_start;
            ppSVar2 = &(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppSVar2 = *ppSVar2 + 1;
            return bVar11;
          }
          std::vector<SWDBit,std::allocator<SWDBit>>::_M_realloc_insert<SWDBit_const&>
                    (this_00,iVar14,&local_98);
          return bVar11;
        }
      }
      else if ((bVar8 == 4) || (bVar8 == 2)) {
        pSVar17 = (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
            super__Vector_impl_data._M_finish != pSVar17) {
          (tran->bits).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
          super__Vector_impl_data._M_finish = pSVar17;
        }
        pSVar3 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                 super__Vector_impl_data._M_start;
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<SWDBit*,std::back_insert_iterator<std::vector<SWDBit,std::allocator<SWDBit>>>>
                  (pSVar3,pSVar3 + 0xc,
                   (back_insert_iterator<std::vector<SWDBit,_std::allocator<SWDBit>_>_>)__result);
        pSVar17 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar16 = pSVar17 + 0xc;
        __n = (long)(this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pSVar16;
        pSVar10 = pSVar16;
        if (__n != 0) {
          memmove(pSVar17,pSVar16,__n);
          pSVar10 = (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        }
        pSVar17 = (pointer)((long)pSVar17 + ((long)pSVar10 - (long)pSVar16));
        if (pSVar10 == pSVar17) {
          return true;
        }
        (this->mBitsBuffer).super__Vector_base<SWDBit,_std::allocator<SWDBit>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar17;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SWDParser::IsOperation( SWDOperation& tran )
{
    tran.Clear();

    // read enough bits so that we don't have to worry of subscripts out of range
    BufferBits( TRAN_REQ_AND_ACK );

    // turn the bits into a byte
    tran.request_byte = 0;
    for( size_t cnt = 0; cnt < 8; ++cnt )
    {
        tran.request_byte >>= 1;
        tran.request_byte |= ( mBitsBuffer[ cnt ].IsHigh() ? 0x80 : 0 );
    }

    // are the request's constant bits (start, stop & park) wrong?
    if( ( tran.request_byte & 0xC1 ) != 0x81 )
        return false;

    // get the indivitual bits
    tran.APnDP = ( tran.request_byte & 0x02 ) != 0;                   //(mBitsBuffer[1].state_falling == BIT_HIGH);
    tran.RnW = ( tran.request_byte & 0x04 ) != 0;                     //(mBitsBuffer[2].state_falling == BIT_HIGH);
    tran.addr = ( tran.request_byte & 0x18 ) >> 1;                    //(mBitsBuffer[3].state_falling == BIT_HIGH ? (1<<2) : 0)
                                                                      //| (mBitsBuffer[4].state_falling == BIT_HIGH ? (1<<3) : 0);
    tran.parity_read = ( ( tran.request_byte & 0x20 ) != 0 ? 1 : 0 ); //(mBitsBuffer[5].state_falling == BIT_HIGH ? 1 : 0);

    // check parity
    int check = ( mBitsBuffer[ 1 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 2 ].state_rising == BIT_HIGH ? 1 : 0 ) +
                ( mBitsBuffer[ 3 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 4 ].state_rising == BIT_HIGH ? 1 : 0 );

    if( tran.parity_read != ( check & 1 ) )
        return false;

    // Set the actual register in this operation based on the data from the request
    // and the previous select register state.
    tran.SetRegister( mSelectRegister );

    // get the ACK value
    tran.ACK = ( mBitsBuffer[ 9 ].state_rising == BIT_HIGH ? 1 : 0 ) + ( mBitsBuffer[ 10 ].state_rising == BIT_HIGH ? 2 : 0 ) +
               ( mBitsBuffer[ 11 ].state_rising == BIT_HIGH ? 4 : 0 );

    // we're only handling OK, WAIT and FAULT responses
    if( tran.ACK == ACK_WAIT || tran.ACK == ACK_FAULT )
    {
        // copy this operation's bits
        tran.bits.clear();
        std::copy( mBitsBuffer.begin(), mBitsBuffer.begin() + TRAN_REQ_AND_ACK, std::back_inserter( tran.bits ) );

        // consume this operation's bits
        mBitsBuffer.erase( mBitsBuffer.begin(), mBitsBuffer.begin() + TRAN_REQ_AND_ACK );

        return true;
    }

    if( tran.ACK != ACK_OK )
        return false;

    BufferBits( TRAN_READ_LENGTH );

    // turnaround if write operation
    bool read_rising = true;
    std::vector<SWDBit>::iterator bi( mBitsBuffer.begin() + 12 );
    if( !tran.IsRead() )
    {
        BufferBits( TRAN_WRITE_LENGTH );
        ++bi;
        // !!! read_rising = false;
    }

    // read the data
    tran.data = 0;
    check = 0;
    size_t ndx;
    for( ndx = 0; ndx < 32; ndx++ )
    {
        tran.data >>= 1;

        if( bi[ ndx ].IsHigh( read_rising ) )
        {
            tran.data |= 0x80000000;
            ++check;
        }
    }

    // data parity
    tran.data_parity = bi[ ndx ].IsHigh( read_rising ) ? 1 : 0;

    tran.data_parity_ok = ( tran.data_parity == ( check & 1 ) );

    if( !tran.data_parity_ok )
        return false;

    // if this is a SELECT register write, remember the value
    if( tran.reg == SWDR_DP_SELECT && !tran.RnW )
        mSelectRegister = tran.data;

    // buffered trailing zeros
    ++ndx;
    bool all_zeros = true;
    while( bi + ndx < mBitsBuffer.end() )
    {
        if( bi[ ndx ].IsHigh( read_rising ) )
        {
            all_zeros = false;
            break;
        }

        ++ndx;
    }

    // if we haven't seen a high bit carry on until we do
    if( all_zeros )
    {
        // read the remaining zero bits
        SWDBit bit;
        while( 1 )
        {
            bit = ParseBit();
            if( bit.IsHigh( read_rising ) )
                break;

            mBitsBuffer.push_back( bit );
        }

        // give the bits to the tran object
        tran.bits = mBitsBuffer;
        mBitsBuffer.clear();

        // keep the high bit because that one is probably next operation's start bit
        mBitsBuffer.push_back( bit );
    }
    else
    {
        // copy this operation's bits
        tran.bits.clear();
        std::copy( mBitsBuffer.begin(), mBitsBuffer.begin() + ndx, std::back_inserter( tran.bits ) );

        // remove this operation's bits from the buffer
        mBitsBuffer.erase( mBitsBuffer.begin(), mBitsBuffer.begin() + ndx );
    }

    return true;
}